

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__cloexec_ioctl(int fd,int set)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int r;
  int set_local;
  int fd_local;
  
  do {
    iVar1 = 0x5450;
    if (set != 0) {
      iVar1 = 0x5451;
    }
    iVar1 = ioctl(fd,(long)iVar1);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (iVar1 == 0) {
    set_local = 0;
  }
  else {
    piVar2 = __errno_location();
    set_local = -*piVar2;
  }
  return set_local;
}

Assistant:

int uv__cloexec_ioctl(int fd, int set) {
  int r;

  do
    r = ioctl(fd, set ? FIOCLEX : FIONCLEX);
  while (r == -1 && errno == EINTR);

  if (r)
    return -errno;

  return 0;
}